

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O0

void __thiscall amrex::DeriveRec::buildBC(DeriveRec *this,DescriptorList *d_list)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  BCRec *pBVar4;
  long in_RDI;
  int j;
  int *bc;
  int k;
  StateDescriptor *d;
  StateRange *r;
  int *bci;
  int k_00;
  StateDescriptor *this_00;
  int local_44;
  int local_34;
  long local_28;
  long local_20;
  
  this_00 = *(StateDescriptor **)(in_RDI + 0x90);
  if (this_00 != (StateDescriptor *)0x0) {
    operator_delete__(this_00);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(*(int *)(in_RDI + 0x80) * 6);
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *(void **)(in_RDI + 0x90) = pvVar3;
  local_20 = *(long *)(in_RDI + 0x90);
  for (local_28 = *(long *)(in_RDI + 0x88); local_28 != 0; local_28 = *(long *)(local_28 + 0x10)) {
    k_00 = (int)((ulong)in_RDI >> 0x20);
    DescriptorList::operator[]((DescriptorList *)this_00,k_00);
    for (local_34 = 0; local_34 < *(int *)(local_28 + 8); local_34 = local_34 + 1) {
      pBVar4 = StateDescriptor::getBC(this_00,k_00);
      for (local_44 = 0; local_44 < 6; local_44 = local_44 + 1) {
        *(int *)(local_20 + (long)local_44 * 4) = pBVar4->bc[local_44];
      }
      local_20 = local_20 + 0x18;
    }
  }
  return;
}

Assistant:

void
DeriveRec::buildBC (const DescriptorList& d_list)
{
    BL_ASSERT(nsr > 0);
    delete [] bcr;
    bcr = new int[2*AMREX_SPACEDIM*n_state];
    int* bci = bcr;
    for (DeriveRec::StateRange* r = rng; r != 0; r = r->next)
    {
        const StateDescriptor& d = d_list[r->typ];

        for (int k = 0; k < r->nc; k++)
        {
            const int* bc = d.getBC(r->sc + k).vect();

            for (int j = 0; j < 2*AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[j];
            }
            bci += 2*AMREX_SPACEDIM;
        }
    }
}